

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BDVFile.cpp
# Opt level: O0

bool BDVFile::verifyFormat(vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool local_b2;
  bool local_a2;
  undefined5 in_stack_ffffffffffffff68;
  byte bVar4;
  byte bVar5;
  allocator<char> in_stack_ffffffffffffff6f;
  string *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [47];
  bool local_1;
  
  std::allocator<char>::allocator();
  bVar2 = false;
  bVar1 = false;
  bVar5 = 0;
  bVar4 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (allocator<char> *)in_stack_ffffffffffffff70);
  bVar3 = find_str_in_buf(in_stack_ffffffffffffff70,
                          (vector<char,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff6f,
                                   CONCAT16(bVar5,CONCAT15(bVar4,in_stack_ffffffffffffff68))));
  local_a2 = true;
  if (!bVar3) {
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (allocator<char> *)in_stack_ffffffffffffff70);
    bVar1 = true;
    bVar3 = find_str_in_buf(in_stack_ffffffffffffff70,
                            (vector<char,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff6f,
                                     CONCAT16(bVar5,CONCAT15(bVar4,in_stack_ffffffffffffff68))));
    local_b2 = false;
    if (bVar3) {
      std::allocator<char>::allocator();
      bVar5 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (allocator<char> *)in_stack_ffffffffffffff70);
      bVar4 = 1;
      local_b2 = find_str_in_buf(in_stack_ffffffffffffff70,
                                 (vector<char,_std::allocator<char>_> *)
                                 CONCAT17(in_stack_ffffffffffffff6f,
                                          CONCAT16(bVar5,CONCAT15(1,in_stack_ffffffffffffff68))));
    }
    local_a2 = local_b2;
  }
  local_1 = local_a2;
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  }
  if ((bVar5 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_68);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_69);
  }
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return (bool)(local_1 & 1);
}

Assistant:

bool BDVFile::verifyFormat(std::vector<char> &buf) {
	return find_str_in_buf("dd:1.3?,r?-=bb", buf) ||
	       (find_str_in_buf("<<format.asc>>", buf) && find_str_in_buf("<<pins.asc>>", buf));
}